

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::RefCountersImpl::
ObjectWrapper<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator>::DestroyObject
          (ObjectWrapper<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator> *this)

{
  TextureViewGLImpl *this_00;
  void *in_RSI;
  ObjectWrapper<Diligent::TextureViewGLImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  if (this->m_pAllocator == (FixedBlockMemoryAllocator *)0x0) {
    this_00 = this->m_pObject;
    if (this_00 != (TextureViewGLImpl *)0x0) {
      TextureViewGLImpl::~TextureViewGLImpl(this_00);
      RefCountedObject<Diligent::ITextureViewGL>::operator_delete
                ((RefCountedObject<Diligent::ITextureViewGL> *)this_00,in_RSI);
    }
  }
  else {
    TextureViewGLImpl::~TextureViewGLImpl(this->m_pObject);
    FixedBlockMemoryAllocator::Free(this->m_pAllocator,this->m_pObject);
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }